

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

BN * __thiscall BN::mulbase(BN *__return_storage_ptr__,BN *this,bt *multiplier)

{
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_30;
  
  BN((BN *)&local_30,this);
  mulbaseappr((BN *)&local_30,multiplier);
  BN(__return_storage_ptr__,(BN *)&local_30);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

const BN BN::mulbase(const bt &multiplier)const
{
    return move(BN(*this).mulbaseappr(multiplier));
}